

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int k;
  ulong uVar16;
  int j;
  ulong uVar17;
  float sumOverEndState;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar3 = this->kPatternCount;
  uVar4 = this->kCategoryCount;
  lVar11 = 0;
  pfVar7 = this->gTransitionMatrices[firstDerivativeIndex];
  for (uVar13 = 0; uVar13 != (~((int)uVar4 >> 0x1f) & uVar4); uVar13 = uVar13 + 1) {
    uVar5 = this->kStateCount;
    lVar15 = (long)this->kPartialsPaddedStateCount;
    fVar2 = categoryWeights[uVar13];
    pfVar8 = this->grandNumeratorDerivTmp;
    pfVar9 = this->grandDenominatorDerivTmp;
    iVar6 = this->kMatrixSize;
    pfVar10 = (float *)(lVar11 * lVar15 + (long)postOrderPartial);
    for (uVar12 = 0; uVar12 != (~((int)uVar3 >> 0x1f) & uVar3); uVar12 = uVar12 + 1) {
      auVar18 = ZEXT816(0) << 0x40;
      auVar19 = ZEXT816(0) << 0x40;
      uVar16 = 0;
      iVar14 = iVar6 * (int)uVar13;
      while (uVar16 != (~((int)uVar5 >> 0x1f) & uVar5)) {
        auVar20 = ZEXT816(0) << 0x40;
        for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)pfVar7[(long)iVar14 + uVar17]),
                                    ZEXT416((uint)pfVar10[uVar17]));
        }
        lVar1 = uVar16 + (uVar13 * (long)(int)uVar3 + uVar12) * lVar15;
        uVar16 = uVar16 + 1;
        iVar14 = iVar14 + uVar5 + 1;
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)preOrderPartial[lVar1]),
                                  ZEXT416((uint)postOrderPartial[lVar1]));
        auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)preOrderPartial[lVar1]),auVar20);
      }
      auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar2),ZEXT416((uint)pfVar8[uVar12]));
      pfVar10 = pfVar10 + lVar15;
      pfVar8[uVar12] = auVar18._0_4_;
      auVar19 = vfmadd213ss_fma(auVar19,ZEXT416((uint)fVar2),ZEXT416((uint)pfVar9[uVar12]));
      pfVar9[uVar12] = auVar19._0_4_;
    }
    lVar11 = lVar11 + (long)(int)uVar3 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}